

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O1

void __thiscall FIX::double_conversion::Bignum::MultiplyByUInt32(Bignum *this,uint32_t factor)

{
  int iVar1;
  uint *puVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  
  if (factor != 1) {
    if (factor == 0) {
      Zero(this);
      return;
    }
    if (this->used_digits_ != 0) {
      if (this->used_digits_ < 1) {
        uVar4 = 0;
      }
      else {
        puVar2 = (this->bigits_).start_;
        lVar5 = 0;
        uVar4 = 0;
        do {
          if ((this->bigits_).length_ <= lVar5) goto LAB_0016c5bb;
          uVar4 = (ulong)puVar2[lVar5] * (ulong)factor + uVar4;
          puVar2[lVar5] = (uint)uVar4 & 0xfffffff;
          uVar4 = uVar4 >> 0x1c;
          lVar5 = lVar5 + 1;
        } while (lVar5 < this->used_digits_);
      }
      if (uVar4 != 0) {
        puVar2 = (this->bigits_).start_;
        do {
          iVar1 = this->used_digits_;
          if (0x7f < (long)iVar1) {
            abort();
          }
          if ((iVar1 < 0) || ((this->bigits_).length_ <= iVar1)) {
LAB_0016c5bb:
            __assert_fail("0 <= index && index < length_",
                          "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/utils.h"
                          ,0xcc,
                          "T &FIX::double_conversion::Vector<unsigned int>::operator[](int) const [T = unsigned int]"
                         );
          }
          puVar2[iVar1] = (uint)uVar4 & 0xfffffff;
          this->used_digits_ = this->used_digits_ + 1;
          bVar3 = 0xfffffff < uVar4;
          uVar4 = uVar4 >> 0x1c;
        } while (bVar3);
      }
    }
  }
  return;
}

Assistant:

void Bignum::MultiplyByUInt32(uint32_t factor) {
  if (factor == 1) return;
  if (factor == 0) {
    Zero();
    return;
  }
  if (used_digits_ == 0) return;

  // The product of a bigit with the factor is of size kBigitSize + 32.
  // Assert that this number + 1 (for the carry) fits into double chunk.
  ASSERT(kDoubleChunkSize >= kBigitSize + 32 + 1);
  DoubleChunk carry = 0;
  for (int i = 0; i < used_digits_; ++i) {
    DoubleChunk product = static_cast<DoubleChunk>(factor) * bigits_[i] + carry;
    bigits_[i] = static_cast<Chunk>(product & kBigitMask);
    carry = (product >> kBigitSize);
  }
  while (carry != 0) {
    EnsureCapacity(used_digits_ + 1);
    bigits_[used_digits_] = carry & kBigitMask;
    used_digits_++;
    carry >>= kBigitSize;
  }
}